

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::get_subpass_meta_for_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,Hash render_pass_hash,
          SubpassMeta *meta)

{
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  
  piVar2 = (int *)create_info->pNext;
  pVVar1 = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>((VkStructureType)piVar2,create_info);
  if (pVVar1 == (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0 || render_pass_hash != 0) {
    if (render_pass_hash != 0) {
      bVar3 = get_subpass_meta_for_render_pass_hash(this,render_pass_hash,create_info->subpass,meta)
      ;
      return bVar3;
    }
    bVar3 = false;
  }
  else {
    bVar3 = (pVVar1->flags & 0xc) == 4;
  }
  do {
    if (piVar2 == (int *)0x0) {
      meta->uses_color = false;
      bVar4 = false;
LAB_0011b4ab:
      meta->uses_depth_stencil = bVar4;
      if (bVar3) {
        meta->uses_depth_stencil = true;
      }
      return true;
    }
    if (*piVar2 == 0x3b9b75e2) {
      meta->uses_color = piVar2[5] != 0;
      bVar4 = true;
      if (piVar2[8] == 0) {
        bVar4 = piVar2[9] != 0;
      }
      goto LAB_0011b4ab;
    }
    piVar2 = *(int **)(piVar2 + 2);
  } while( true );
}

Assistant:

bool StateRecorder::Impl::get_subpass_meta_for_pipeline(const VkGraphicsPipelineCreateInfo &create_info,
                                                        Hash render_pass_hash,
                                                        SubpassMeta *meta) const
{
	auto *library_info = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT, create_info.pNext);
	bool force_depth_stencil = false;

	if (!render_pass_hash && library_info)
	{
		// If we have fragment shaders, but no idea what our render pass looks like,
		// we might be forced to emit depth stencil state, even if we don't end up needing it.
		// VUID we consider here:
		// If renderPass is VK_NULL_HANDLE and the pipeline is being created with fragment shader state
		// but not fragment output interface state,
		// pDepthStencilState must be a valid pointer to a valid VkPipelineDepthStencilStateCreateInfo structure
		bool fragment = (library_info->flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT) != 0;
		bool output = (library_info->flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;
		force_depth_stencil = fragment && !output;
	}

	// If a render pass is present, use that.
	if (render_pass_hash)
	{
		if (!get_subpass_meta_for_render_pass_hash(render_pass_hash, create_info.subpass, meta))
			return false;
	}
	else if (auto *rendering_create_info = find_pnext<VkPipelineRenderingCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR, create_info.pNext))
	{
		meta->uses_color = rendering_create_info->colorAttachmentCount > 0;
		meta->uses_depth_stencil = rendering_create_info->depthAttachmentFormat != VK_FORMAT_UNDEFINED ||
		                           rendering_create_info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED;
	}
	else
	{
		meta->uses_color = false;
		meta->uses_depth_stencil = false;
	}

	if (force_depth_stencil)
		meta->uses_depth_stencil = true;

	return true;
}